

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void biffwrite(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  anon_union_8_4_1dda36f5_for_runsv aVar2;
  anon_union_8_4_1dda36f5_for_runsv __ptr;
  int32_t tmp;
  int iVar3;
  FILE *__stream;
  size_t sVar4;
  ulong uVar5;
  char cVar6;
  uint uVar7;
  ushort *puVar8;
  char typ;
  runsdef val;
  int bin_mode;
  char buf [32];
  
  __stream = (FILE *)bif_get_file(ctx,(int *)0x0,&bin_mode);
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  val.runstyp = prVar1[-1].runstyp;
  val._1_7_ = *(undefined7 *)&prVar1[-1].field_0x1;
  val.runsv = prVar1[-1].runsv;
  typ = val.runstyp;
  if (bin_mode == 0) {
    if (val.runstyp != '\x03') {
LAB_00125010:
      ctx->bifcxrun->runcxerr->errcxptr->erraav[0].errastr = "fwrite";
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
      runsign(ctx->bifcxrun,0x3ff);
    }
    uVar7 = *(ushort *)val.runsv.runsvstr - 2;
    puVar8 = (ushort *)(val.runsv.runsvnum + 2);
    do {
      if (uVar7 == 0) goto LAB_00124fe1;
      for (uVar5 = 0; (uVar7 != 0 && (uVar5 < 0xff)); uVar5 = uVar5 + 1) {
        cVar6 = (char)*puVar8;
        if ((1 < uVar7) && (cVar6 == '\\')) {
          uVar7 = uVar7 - 1;
          cVar6 = *(char *)((long)puVar8 + 1);
          puVar8 = (ushort *)((long)puVar8 + 1);
          if (cVar6 == 'n') {
            cVar6 = '\n';
          }
          else if (cVar6 == 't') {
            cVar6 = '\t';
          }
        }
        buf[uVar5] = cVar6;
        puVar8 = (ushort *)((long)puVar8 + 1);
        uVar7 = uVar7 - 1;
      }
      buf[uVar5] = '\0';
      iVar3 = fputs(buf,__stream);
    } while (iVar3 != -1);
  }
  else {
    sVar4 = fwrite(&typ,1,1,__stream);
    aVar2 = val.runsv;
    if (sVar4 == 1) {
      if (typ != '\b') {
        if (typ == '\x03') {
          sVar4 = (size_t)*(ushort *)val.runsv.runsvstr;
        }
        else {
          if (typ != '\x01') goto LAB_00125010;
          buf[0] = val.runsv._0_1_;
          buf[1] = val.runsv._1_1_;
          buf[2] = val.runsv._2_1_;
          buf[3] = val.runsv._3_1_;
          sVar4 = 4;
          val.runsv.runsvstr = (uchar *)buf;
        }
        __ptr = val.runsv;
        val.runsv = aVar2;
        sVar4 = fwrite(__ptr.runsvstr,sVar4,1,__stream);
        if (sVar4 != 1) goto LAB_00124fec;
      }
LAB_00124fe1:
      runpnil(ctx->bifcxrun);
      return;
    }
  }
LAB_00124fec:
  val.runstyp = '\b';
  runpush(ctx->bifcxrun,8,&val);
  return;
}

Assistant:

void biffwrite(bifcxdef *ctx, int argc)
{
    osfildef *fp;
    char      typ;
    char      buf[32];
    runsdef   val;
    int       bin_mode;
    
    /* get the file */
    bifcntargs(ctx, 2, argc);
    fp = bif_get_file(ctx, (int *)0, &bin_mode);

    /* get the value to write */
    runpop(ctx->bifcxrun, &val);
    typ = val.runstyp;

    if (bin_mode)
    {
        /* put a byte indicating the type */
        if (osfwb(fp, &typ, 1))
            goto ret_error;
        
        /* see what type of data we want to put */
        switch(typ)
        {
        case DAT_NUMBER:
            oswp4s(buf, val.runsv.runsvnum);
            if (osfwb(fp, buf, 4))
                goto ret_error;
            break;
            
        case DAT_SSTRING:
            /* write the string, including the length prefix */
            if (osfwb(fp, val.runsv.runsvstr, osrp2(val.runsv.runsvstr)))
                goto ret_error;
            break;
            
        case DAT_TRUE:
            /* all we need for this is the type prefix */
            break;
            
        default:
            /* other types are not acceptable */
            runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "fwrite");
        }
    }
    else
    {
        uint rem;
        uchar *p;
        
        switch(typ)
        {
        case DAT_SSTRING:
            /*
             *   Copy and translate the string to our buffer, in pieces if
             *   the size of the string exceeds that of our buffer.  If we
             *   encounter any escape codes, translate them.  
             */
            rem = osrp2(val.runsv.runsvstr) - 2;
            p = val.runsv.runsvstr + 2;
            while (rem > 0)
            {
                uchar *dst;
                uchar buf[256];

                /* fill up the buffer */
                for (dst = buf ;
                     rem != 0 && (size_t)(dst - buf) < sizeof(buf) - 1 ;
                     ++p, --rem)
                {
                    /* if we have an escape character, translate it */
                    if (*p == '\\' && rem > 1)
                    {
                        /* skip the opening slash */
                        ++p;
                        --rem;

                        /* translate it */
                        switch(*p)
                        {
                        case 'n':
                            *dst++ = '\n';
                            break;

                        case 't':
                            *dst++ = '\t';
                            break;

                        default:
                            *dst++ = *p;
                            break;
                        }
                    }
                    else
                    {
                        /* copy this character directly */
                        *dst++ = *p;
                    }
                }

                /* null-terminate the buffer */
                *dst = '\0';

                /* write it out */
                if (osfputs((char *)buf, fp) == EOF)
                    goto ret_error;
            }

            /* done */
            break;

        default:
            /* other types are not allowed */
            runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "fwrite");
        }
    }

    /* success */
    runpnil(ctx->bifcxrun);
    return;

ret_error:
    val.runstyp = DAT_TRUE;
    runpush(ctx->bifcxrun, DAT_TRUE, &val);
}